

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

void FastPForLib::Simple16<false>::unpack7_4(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x15 & 0x7f;
  puVar2[1] = *puVar1 >> 0xe & 0x7f;
  puVar2[2] = *puVar1 >> 7 & 0x7f;
  puVar2[3] = *puVar1 & 0x7f;
  *in = puVar1 + 1;
  *out = puVar2 + 4;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack7_4(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 21) & 0x7f;
  pout[1] = (pin[0] >> 14) & 0x7f;
  pout[2] = (pin[0] >> 7) & 0x7f;
  pout[3] = pin[0] & 0x7f;

  *in = pin + 1;
  *out = pout + 4;
}